

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_vertical_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [12];
  undefined1 auVar68 [16];
  undefined1 auVar69 [12];
  undefined1 auVar70 [14];
  undefined1 auVar71 [12];
  unkbyte10 Var72;
  undefined1 auVar73 [12];
  unkbyte10 Var74;
  undefined1 auVar75 [12];
  undefined1 auVar76 [15];
  unkuint9 Var77;
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  unkuint9 Var83;
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  unkuint9 Var86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [11];
  undefined1 auVar90 [13];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [11];
  undefined1 auVar95 [13];
  undefined1 auVar96 [14];
  undefined1 auVar97 [12];
  undefined1 auVar98 [14];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [14];
  long lVar116;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  undefined4 uVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar117 [16];
  byte bVar125;
  char cVar161;
  char cVar163;
  char cVar165;
  char cVar167;
  short sVar169;
  ushort uVar170;
  undefined1 auVar131 [14];
  undefined2 uVar126;
  undefined2 uVar452;
  byte bVar151;
  char cVar153;
  char cVar156;
  byte bVar157;
  char cVar159;
  uint uVar127;
  byte bVar154;
  byte bVar160;
  byte bVar162;
  byte bVar164;
  byte bVar166;
  ushort uVar168;
  undefined1 uVar171;
  undefined1 auVar132 [16];
  ushort uVar276;
  ushort uVar278;
  ushort uVar280;
  ushort uVar282;
  short sVar283;
  ushort uVar284;
  short sVar285;
  ushort uVar286;
  undefined1 auVar248 [14];
  undefined1 auVar249 [14];
  undefined1 auVar392 [14];
  ushort uVar172;
  undefined1 auVar133 [16];
  undefined1 auVar148 [16];
  undefined1 auVar174 [14];
  ushort uVar173;
  ushort uVar193;
  undefined4 uVar194;
  undefined1 auVar176 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar175 [14];
  ushort uVar195;
  undefined1 auVar185 [16];
  undefined1 auVar192 [16];
  byte bVar196;
  byte bVar216;
  undefined1 auVar198 [14];
  undefined1 auVar199 [14];
  ulong uVar197;
  byte bVar209;
  byte bVar210;
  byte bVar211;
  byte bVar212;
  byte bVar213;
  byte bVar214;
  ushort uVar215;
  undefined1 auVar200 [16];
  undefined1 auVar207 [16];
  ushort uVar217;
  undefined4 uVar218;
  short sVar237;
  undefined4 uVar238;
  short sVar240;
  undefined4 uVar241;
  short sVar243;
  undefined1 auVar220 [16];
  uint uVar244;
  undefined1 auVar228 [16];
  short sVar236;
  short sVar239;
  short sVar242;
  short sVar245;
  undefined1 auVar229 [16];
  ushort uVar246;
  undefined1 auVar247 [12];
  short sVar275;
  short sVar277;
  short sVar279;
  short sVar281;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  ushort uVar287;
  undefined1 auVar267 [16];
  undefined2 uVar453;
  short sVar302;
  short sVar306;
  byte bVar311;
  byte bVar312;
  byte bVar313;
  byte bVar314;
  byte bVar315;
  byte bVar316;
  undefined1 auVar288 [16];
  byte bVar310;
  byte bVar317;
  undefined1 auVar289 [16];
  short sVar303;
  short sVar304;
  short sVar305;
  short sVar307;
  short sVar308;
  short sVar309;
  undefined1 auVar298 [16];
  ushort uVar318;
  ushort uVar334;
  ushort uVar337;
  short sVar338;
  ushort uVar339;
  short sVar340;
  undefined1 auVar320 [14];
  undefined1 auVar319 [12];
  short sVar332;
  short sVar333;
  short sVar335;
  short sVar336;
  undefined1 auVar321 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar341 [12];
  byte bVar343;
  byte bVar344;
  short sVar355;
  short sVar360;
  short sVar365;
  short sVar370;
  short sVar374;
  short sVar375;
  short sVar380;
  short sVar381;
  undefined1 auVar348 [14];
  short sVar345;
  short sVar346;
  byte bVar353;
  short sVar354;
  short sVar356;
  byte bVar358;
  short sVar359;
  short sVar361;
  byte bVar363;
  short sVar364;
  short sVar366;
  byte bVar368;
  short sVar369;
  short sVar371;
  byte bVar373;
  undefined1 auVar347 [12];
  short sVar376;
  byte bVar378;
  short sVar382;
  byte bVar385;
  undefined1 auVar350 [16];
  byte bVar352;
  byte bVar357;
  byte bVar362;
  byte bVar367;
  byte bVar372;
  byte bVar377;
  byte bVar379;
  byte bVar383;
  byte bVar384;
  byte bVar386;
  byte bVar390;
  byte bVar391;
  undefined1 auVar351 [16];
  short sVar387;
  short sVar388;
  short sVar389;
  undefined1 auVar393 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined2 uVar399;
  short sVar400;
  short sVar401;
  short sVar402;
  short sVar403;
  undefined4 uVar404;
  short sVar413;
  short sVar414;
  short sVar415;
  short sVar416;
  short sVar417;
  short sVar418;
  short sVar419;
  short sVar420;
  undefined4 uVar421;
  short sVar422;
  short sVar423;
  short sVar424;
  short sVar425;
  short sVar426;
  short sVar427;
  undefined4 uVar428;
  undefined1 auVar409 [14];
  undefined1 auVar410 [14];
  undefined1 uVar430;
  undefined4 uVar429;
  byte bVar433;
  undefined1 auVar432 [16];
  short sVar450;
  undefined1 auVar434 [14];
  undefined1 auVar435 [14];
  undefined1 auVar436 [14];
  short sVar445;
  short sVar446;
  short sVar447;
  short sVar448;
  short sVar449;
  undefined1 auVar437 [16];
  ushort uVar451;
  undefined1 auVar438 [16];
  undefined6 uVar128;
  undefined8 uVar129;
  undefined1 auVar141 [16];
  undefined1 auVar134 [16];
  undefined1 auVar142 [16];
  undefined1 auVar130 [12];
  undefined1 auVar135 [16];
  undefined1 auVar143 [16];
  undefined1 auVar149 [16];
  undefined1 auVar136 [16];
  undefined1 auVar144 [16];
  undefined1 auVar137 [16];
  undefined1 auVar145 [16];
  undefined1 auVar150 [16];
  undefined1 auVar138 [16];
  undefined1 auVar146 [16];
  undefined1 auVar139 [16];
  undefined1 auVar147 [16];
  undefined1 auVar140 [16];
  byte bVar152;
  byte bVar155;
  byte bVar158;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar186 [16];
  undefined1 auVar180 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar181 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 uVar208;
  undefined1 auVar219 [12];
  undefined1 auVar221 [16];
  undefined1 auVar230 [16];
  undefined1 auVar222 [16];
  undefined1 auVar231 [16];
  undefined1 auVar223 [16];
  undefined1 auVar232 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar233 [16];
  undefined1 auVar225 [16];
  undefined1 auVar234 [16];
  undefined1 auVar226 [16];
  undefined1 auVar235 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar256 [16];
  undefined1 auVar268 [16];
  undefined1 auVar257 [16];
  undefined1 auVar269 [16];
  undefined1 auVar258 [16];
  undefined1 auVar270 [16];
  undefined1 auVar259 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar260 [16];
  undefined1 auVar272 [16];
  undefined1 auVar261 [16];
  undefined1 auVar273 [16];
  undefined1 auVar291 [16];
  undefined1 auVar299 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar300 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar301 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar290 [16];
  undefined1 auVar322 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar331 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar342 [16];
  undefined1 auVar349 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined6 uVar405;
  undefined8 uVar406;
  undefined1 auVar408 [12];
  undefined1 auVar407 [12];
  undefined1 auVar412 [16];
  undefined1 auVar411 [16];
  undefined1 auVar431 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  
  auVar117 = *(undefined1 (*) [16])(s + -8);
  lVar116 = (long)p;
  puVar1 = s + lVar116 + -8;
  uVar57 = puVar1[1];
  uVar58 = puVar1[0xe];
  auVar233 = *(undefined1 (*) [16])(s + lVar116 * 2 + -8);
  lVar3 = lVar116 * 3;
  puVar2 = s + lVar3 + -8;
  uVar59 = puVar2[1];
  uVar60 = puVar2[0xe];
  auVar226._0_14_ = auVar117._0_14_;
  auVar226[0xe] = auVar117[7];
  auVar226[0xf] = puVar1[7];
  auVar225._14_2_ = auVar226._14_2_;
  auVar225._0_13_ = auVar117._0_13_;
  auVar225[0xd] = puVar1[6];
  auVar224._13_3_ = auVar225._13_3_;
  auVar224._0_12_ = auVar117._0_12_;
  auVar224[0xc] = auVar117[6];
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._0_11_ = auVar117._0_11_;
  auVar223[0xb] = puVar1[5];
  auVar222._11_5_ = auVar223._11_5_;
  auVar222._0_10_ = auVar117._0_10_;
  auVar222[10] = auVar117[5];
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._0_9_ = auVar117._0_9_;
  auVar221[9] = puVar1[4];
  auVar220._9_7_ = auVar221._9_7_;
  auVar220._0_8_ = auVar117._0_8_;
  auVar220[8] = auVar117[4];
  Var72 = CONCAT91(CONCAT81(auVar220._8_8_,puVar1[3]),auVar117[3]);
  auVar71._2_10_ = Var72;
  auVar71[1] = puVar1[2];
  auVar71[0] = auVar117[2];
  auVar70._2_12_ = auVar71;
  auVar70[1] = uVar57;
  auVar70[0] = auVar117[1];
  auVar132._14_2_ = 0;
  auVar132._0_14_ = auVar70;
  auVar132 = auVar132 << 0x10;
  auVar206._0_14_ = auVar233._0_14_;
  auVar206[0xe] = auVar233[7];
  auVar206[0xf] = puVar2[7];
  auVar205._14_2_ = auVar206._14_2_;
  auVar205._0_13_ = auVar233._0_13_;
  auVar205[0xd] = puVar2[6];
  auVar204._13_3_ = auVar205._13_3_;
  auVar204._0_12_ = auVar233._0_12_;
  auVar204[0xc] = auVar233[6];
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._0_11_ = auVar233._0_11_;
  auVar203[0xb] = puVar2[5];
  auVar202._11_5_ = auVar203._11_5_;
  auVar202._0_10_ = auVar233._0_10_;
  auVar202[10] = auVar233[5];
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._0_9_ = auVar233._0_9_;
  auVar201[9] = puVar2[4];
  auVar200._9_7_ = auVar201._9_7_;
  auVar200._0_8_ = auVar233._0_8_;
  auVar200[8] = auVar233[4];
  Var74 = CONCAT91(CONCAT81(auVar200._8_8_,puVar2[3]),auVar233[3]);
  auVar73._2_10_ = Var74;
  auVar73[1] = puVar2[2];
  auVar73[0] = auVar233[2];
  auVar249._2_12_ = auVar73;
  auVar249[1] = uVar59;
  uVar208 = auVar233[1];
  auVar249[0] = uVar208;
  uVar399 = CONCAT11(puVar1[8],auVar117[8]);
  uVar194 = CONCAT13(puVar1[9],CONCAT12(auVar117[9],uVar399));
  uVar405 = CONCAT15(puVar1[10],CONCAT14(auVar117[10],uVar194));
  uVar406 = CONCAT17(puVar1[0xb],CONCAT16(auVar117[0xb],uVar405));
  auVar407._0_10_ = CONCAT19(puVar1[0xc],CONCAT18(auVar117[0xc],uVar406));
  auVar407[10] = auVar117[0xd];
  auVar407[0xb] = puVar1[0xd];
  uVar430 = auVar117[0xe];
  auVar435[0xc] = uVar430;
  auVar435._0_12_ = auVar407;
  auVar435[0xd] = uVar58;
  auVar411[0xe] = auVar117[0xf];
  auVar411._0_14_ = auVar435;
  auVar411[0xf] = puVar1[0xf];
  uVar126 = CONCAT11(puVar2[8],auVar233[8]);
  uVar122 = CONCAT13(puVar2[9],CONCAT12(auVar233[9],uVar126));
  uVar128 = CONCAT15(puVar2[10],CONCAT14(auVar233[10],uVar122));
  uVar129 = CONCAT17(puVar2[0xb],CONCAT16(auVar233[0xb],uVar128));
  auVar130._0_10_ = CONCAT19(puVar2[0xc],CONCAT18(auVar233[0xc],uVar129));
  auVar130[10] = auVar233[0xd];
  auVar130[0xb] = puVar2[0xd];
  uVar171 = auVar233[0xe];
  auVar410[0xc] = uVar171;
  auVar410._0_12_ = auVar130;
  auVar410[0xd] = uVar60;
  auVar250[0xe] = auVar233[0xf];
  auVar250._0_14_ = auVar410;
  auVar250[0xf] = puVar2[0xf];
  uVar334 = (ushort)Var72;
  auVar396._0_12_ = auVar132._0_12_;
  auVar396._12_2_ = uVar334;
  auVar396._14_2_ = (short)Var74;
  auVar395._12_4_ = auVar396._12_4_;
  auVar395._0_10_ = auVar132._0_10_;
  auVar395._10_2_ = auVar73._0_2_;
  auVar394._10_6_ = auVar395._10_6_;
  auVar394._0_8_ = auVar132._0_8_;
  auVar394._8_2_ = auVar71._0_2_;
  auVar75._4_8_ = auVar394._8_8_;
  auVar75._2_2_ = auVar249._0_2_;
  auVar75._0_2_ = auVar70._0_2_;
  auVar393._12_4_ = 0;
  auVar393._0_12_ = auVar75;
  auVar393 = auVar393 << 0x20;
  uVar173 = auVar220._8_2_;
  uVar218 = CONCAT22(auVar200._8_2_,uVar173);
  uVar193 = auVar222._10_2_;
  auVar219._0_8_ = CONCAT26(auVar202._10_2_,CONCAT24(uVar193,uVar218));
  uVar337 = auVar224._12_2_;
  auVar219._8_2_ = uVar337;
  auVar219._10_2_ = auVar204._12_2_;
  auVar227._12_2_ = auVar225._14_2_;
  auVar227._0_12_ = auVar219;
  auVar227._14_2_ = auVar205._14_2_;
  auVar181._12_2_ = (short)((ulong)uVar406 >> 0x30);
  auVar181._0_12_ = auVar407;
  auVar181._14_2_ = (short)((ulong)uVar129 >> 0x30);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._10_2_ = (short)((uint6)uVar128 >> 0x20);
  auVar180._0_10_ = auVar407._0_10_;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = (short)((uint6)uVar405 >> 0x20);
  auVar179._0_8_ = uVar406;
  auVar178._8_8_ = auVar179._8_8_;
  auVar178._6_2_ = (short)((uint)uVar122 >> 0x10);
  auVar178._0_6_ = uVar405;
  auVar177._6_10_ = auVar178._6_10_;
  auVar177._4_2_ = (short)((uint)uVar194 >> 0x10);
  auVar177._0_4_ = uVar194;
  auVar176._4_12_ = auVar177._4_12_;
  auVar176._0_4_ = CONCAT22(uVar126,uVar399);
  uVar404 = CONCAT22((short)((unkuint10)auVar130._0_10_ >> 0x40),
                     (short)((unkuint10)auVar407._0_10_ >> 0x40));
  auVar408._0_8_ = CONCAT26(auVar130._10_2_,CONCAT24(auVar407._10_2_,uVar404));
  auVar408._8_2_ = auVar435._12_2_;
  auVar408._10_2_ = auVar410._12_2_;
  auVar412._12_2_ = auVar411._14_2_;
  auVar412._0_12_ = auVar408;
  auVar412._14_2_ = auVar250._14_2_;
  uVar421 = (undefined4)((ulong)auVar408._0_8_ >> 0x20);
  uVar428 = auVar408._8_4_;
  uVar429 = auVar412._12_4_;
  uVar122 = auVar394._8_4_;
  uVar238 = (undefined4)((ulong)auVar219._0_8_ >> 0x20);
  uVar241 = auVar219._8_4_;
  uVar244 = auVar227._12_4_;
  auVar341._0_8_ = CONCAT44(auVar179._8_4_,uVar238);
  auVar341._8_4_ = uVar241;
  auVar342._12_4_ = auVar180._12_4_;
  auVar342._0_12_ = auVar341;
  auVar435 = auVar342._0_14_;
  uVar194 = auVar177._4_4_;
  auVar432._4_8_ = 0;
  auVar432._0_4_ = uVar244;
  auVar432._12_4_ = uVar194;
  auVar431._8_8_ = auVar432._8_8_;
  auVar431._0_8_ = CONCAT44(auVar176._0_4_,uVar244);
  auVar228._0_8_ = CONCAT44(uVar241,uVar244);
  auVar228._8_4_ = auVar176._0_4_;
  auVar228._12_4_ = uVar194;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = auVar176._0_8_;
  uVar129 = CONCAT44(auVar180._12_4_,uVar218);
  auVar4._8_4_ = uVar238;
  auVar4._0_8_ = uVar129;
  auVar437._12_4_ = 0;
  auVar437._0_12_ = auVar4;
  auVar347._0_8_ = CONCAT44(uVar194,uVar241);
  auVar347._8_4_ = uVar244;
  auVar349._12_4_ = auVar179._8_4_;
  auVar349._0_12_ = auVar347;
  auVar132 = psubusb(auVar349,auVar431);
  auVar288 = psubusb(auVar431,auVar349);
  auVar288 = auVar288 | auVar132;
  auVar182._8_4_ = auVar176._0_4_;
  auVar182._0_8_ = auVar228._0_8_;
  auVar182._12_4_ = uVar194;
  auVar132 = psubusb(auVar182,auVar321);
  auVar250 = psubusb(auVar321,auVar228);
  auVar250 = auVar250 | auVar132;
  bVar310 = auVar288[0];
  bVar433 = auVar288[4];
  bVar125 = (bVar433 < bVar310) * bVar310 | (bVar433 >= bVar310) * bVar433;
  bVar311 = auVar288[1];
  bVar152 = auVar288[5];
  bVar151 = (bVar152 < bVar311) * bVar311 | (bVar152 >= bVar311) * bVar152;
  bVar312 = auVar288[2];
  bVar155 = auVar288[6];
  bVar154 = (bVar155 < bVar312) * bVar312 | (bVar155 >= bVar312) * bVar155;
  bVar313 = auVar288[3];
  bVar158 = auVar288[7];
  bVar157 = (bVar158 < bVar313) * bVar313 | (bVar158 >= bVar313) * bVar158;
  bVar344 = auVar288[8];
  bVar160 = (bVar344 < bVar433) * bVar433 | (bVar344 >= bVar433) * bVar344;
  bVar213 = auVar288[9];
  bVar162 = (bVar213 < bVar152) * bVar152 | (bVar213 >= bVar152) * bVar213;
  bVar214 = auVar288[10];
  bVar164 = (bVar214 < bVar155) * bVar155 | (bVar214 >= bVar155) * bVar214;
  bVar216 = auVar288[0xb];
  bVar166 = (bVar216 < bVar158) * bVar158 | (bVar216 >= bVar158) * bVar216;
  bVar379 = *_thresh;
  bVar384 = _thresh[1];
  bVar386 = _thresh[2];
  bVar391 = _thresh[3];
  bVar314 = _thresh[4];
  bVar315 = _thresh[5];
  bVar316 = _thresh[6];
  bVar317 = _thresh[7];
  uVar127 = CONCAT13(-((byte)((bVar157 < bVar391) * bVar157 | (bVar157 >= bVar391) * bVar391) ==
                      bVar157),
                     CONCAT12(-((byte)((bVar154 < bVar386) * bVar154 |
                                      (bVar154 >= bVar386) * bVar386) == bVar154),
                              CONCAT11(-((byte)((bVar151 < bVar384) * bVar151 |
                                               (bVar151 >= bVar384) * bVar384) == bVar151),
                                       -((byte)((bVar125 < bVar379) * bVar125 |
                                               (bVar125 >= bVar379) * bVar379) == bVar125))));
  auVar207._0_2_ = auVar250._4_2_ >> 1;
  auVar207._2_2_ = auVar250._6_2_ >> 1;
  auVar207._4_2_ = auVar250._8_2_ >> 1;
  auVar207._6_2_ = auVar250._10_2_ >> 1;
  auVar207._8_2_ = auVar250._12_2_ >> 1;
  auVar207._10_2_ = auVar250._14_2_ >> 1;
  auVar207._12_4_ = 0;
  auVar132 = paddusb(auVar250,auVar250);
  auVar132 = paddusb(auVar207 & _DAT_00426c10,auVar132);
  auVar250 = psubusb(auVar132,*(undefined1 (*) [16])_blimit);
  auVar132 = psubusb(auVar342,auVar349);
  auVar251 = psubusb(auVar349,auVar342);
  auVar251 = auVar251 | auVar132;
  auVar132 = psubusb(auVar437,auVar342);
  auVar350 = psubusb(auVar342,auVar437);
  auVar350 = auVar350 | auVar132;
  uVar197 = auVar250._0_8_ & 0xffffffff;
  bVar379 = -((char)uVar197 == '\0') ^ 0xff;
  bVar384 = -((char)(uVar197 >> 8) == '\0') ^ 0xff;
  bVar386 = -((char)(uVar197 >> 0x10) == '\0') ^ 0xff;
  bVar391 = -((char)(uVar197 >> 0x18) == '\0') ^ 0xff;
  bVar125 = -(auVar250[4] == '\0') ^ 0xff;
  bVar151 = -(auVar250[5] == '\0') ^ 0xff;
  bVar154 = -(auVar250[6] == '\0') ^ 0xff;
  bVar343 = -(auVar250[7] == '\0') ^ 0xff;
  bVar196 = (bVar379 < bVar310) * bVar310 | (bVar379 >= bVar310) * bVar379;
  bVar209 = (bVar384 < bVar311) * bVar311 | (bVar384 >= bVar311) * bVar384;
  bVar210 = (bVar386 < bVar312) * bVar312 | (bVar386 >= bVar312) * bVar386;
  bVar211 = (bVar391 < bVar313) * bVar313 | (bVar391 >= bVar313) * bVar391;
  bVar157 = (bVar433 != 0) * bVar433;
  bVar379 = (bVar152 != 0) * bVar152;
  bVar384 = (bVar155 != 0) * bVar155;
  bVar386 = (bVar158 != 0) * bVar158;
  bVar212 = (bVar125 < bVar344) * bVar344 | (bVar125 >= bVar344) * bVar125;
  bVar213 = (bVar151 < bVar213) * bVar213 | (bVar151 >= bVar213) * bVar151;
  bVar214 = (bVar154 < bVar214) * bVar214 | (bVar154 >= bVar214) * bVar154;
  bVar216 = (bVar343 < bVar216) * bVar216 | (bVar343 >= bVar216) * bVar343;
  bVar391 = (auVar288[0xc] != '\0') * auVar288[0xc];
  bVar125 = (auVar288[0xd] != '\0') * auVar288[0xd];
  bVar151 = (auVar288[0xe] != '\0') * auVar288[0xe];
  bVar154 = (auVar288[0xf] != '\0') * auVar288[0xf];
  bVar344 = auVar251[0];
  bVar343 = auVar350[0];
  bVar343 = (bVar343 < bVar344) * bVar344 | (bVar343 >= bVar344) * bVar343;
  bVar344 = auVar251[1];
  bVar352 = auVar350[1];
  bVar352 = (bVar352 < bVar344) * bVar344 | (bVar352 >= bVar344) * bVar352;
  bVar344 = auVar251[2];
  bVar353 = auVar350[2];
  bVar353 = (bVar353 < bVar344) * bVar344 | (bVar353 >= bVar344) * bVar353;
  bVar344 = auVar251[3];
  bVar357 = auVar350[3];
  bVar357 = (bVar357 < bVar344) * bVar344 | (bVar357 >= bVar344) * bVar357;
  bVar344 = auVar251[4];
  bVar358 = auVar350[4];
  bVar358 = (bVar358 < bVar344) * bVar344 | (bVar358 >= bVar344) * bVar358;
  bVar344 = auVar251[5];
  bVar362 = auVar350[5];
  bVar362 = (bVar362 < bVar344) * bVar344 | (bVar362 >= bVar344) * bVar362;
  bVar344 = auVar251[6];
  bVar363 = auVar350[6];
  bVar363 = (bVar363 < bVar344) * bVar344 | (bVar363 >= bVar344) * bVar363;
  bVar344 = auVar251[7];
  bVar367 = auVar350[7];
  bVar367 = (bVar367 < bVar344) * bVar344 | (bVar367 >= bVar344) * bVar367;
  bVar344 = auVar251[8];
  bVar368 = auVar350[8];
  bVar368 = (bVar368 < bVar344) * bVar344 | (bVar368 >= bVar344) * bVar368;
  bVar344 = auVar251[9];
  bVar372 = auVar350[9];
  bVar372 = (bVar372 < bVar344) * bVar344 | (bVar372 >= bVar344) * bVar372;
  bVar344 = auVar251[10];
  bVar373 = auVar350[10];
  bVar373 = (bVar373 < bVar344) * bVar344 | (bVar373 >= bVar344) * bVar373;
  bVar344 = auVar251[0xb];
  bVar377 = auVar350[0xb];
  bVar377 = (bVar377 < bVar344) * bVar344 | (bVar377 >= bVar344) * bVar377;
  bVar344 = auVar251[0xc];
  bVar378 = auVar350[0xc];
  bVar378 = (bVar378 < bVar344) * bVar344 | (bVar378 >= bVar344) * bVar378;
  bVar344 = auVar251[0xd];
  bVar383 = auVar350[0xd];
  bVar383 = (bVar383 < bVar344) * bVar344 | (bVar383 >= bVar344) * bVar383;
  bVar344 = auVar251[0xe];
  bVar385 = auVar350[0xe];
  bVar390 = auVar350[0xf];
  bVar385 = (bVar385 < bVar344) * bVar344 | (bVar385 >= bVar344) * bVar385;
  bVar344 = auVar251[0xf];
  bVar390 = (bVar390 < bVar344) * bVar344 | (bVar390 >= bVar344) * bVar390;
  bVar344 = (bVar343 < bVar196) * bVar196 | (bVar343 >= bVar196) * bVar343;
  bVar196 = (bVar352 < bVar209) * bVar209 | (bVar352 >= bVar209) * bVar352;
  bVar209 = (bVar353 < bVar210) * bVar210 | (bVar353 >= bVar210) * bVar353;
  bVar210 = (bVar357 < bVar211) * bVar211 | (bVar357 >= bVar211) * bVar357;
  bVar157 = (bVar358 < bVar157) * bVar157 | (bVar358 >= bVar157) * bVar358;
  bVar211 = (bVar362 < bVar379) * bVar379 | (bVar362 >= bVar379) * bVar362;
  bVar343 = (bVar363 < bVar384) * bVar384 | (bVar363 >= bVar384) * bVar363;
  bVar352 = (bVar367 < bVar386) * bVar386 | (bVar367 >= bVar386) * bVar367;
  bVar212 = (bVar368 < bVar212) * bVar212 | (bVar368 >= bVar212) * bVar368;
  bVar213 = (bVar372 < bVar213) * bVar213 | (bVar372 >= bVar213) * bVar372;
  bVar214 = (bVar373 < bVar214) * bVar214 | (bVar373 >= bVar214) * bVar373;
  bVar216 = (bVar377 < bVar216) * bVar216 | (bVar377 >= bVar216) * bVar377;
  bVar379 = (bVar378 < bVar391) * bVar391 | (bVar378 >= bVar391) * bVar378;
  bVar384 = (bVar383 < bVar125) * bVar125 | (bVar383 >= bVar125) * bVar383;
  bVar386 = (bVar385 < bVar151) * bVar151 | (bVar385 >= bVar151) * bVar385;
  bVar391 = (bVar390 < bVar154) * bVar154 | (bVar390 >= bVar154) * bVar390;
  bVar357 = (bVar157 < bVar344) * bVar344 | (bVar157 >= bVar344) * bVar157;
  bVar358 = (bVar211 < bVar196) * bVar196 | (bVar211 >= bVar196) * bVar211;
  bVar362 = (bVar343 < bVar209) * bVar209 | (bVar343 >= bVar209) * bVar343;
  bVar363 = (bVar352 < bVar210) * bVar210 | (bVar352 >= bVar210) * bVar352;
  bVar367 = (bVar212 < bVar157) * bVar157 | (bVar212 >= bVar157) * bVar212;
  bVar368 = (bVar213 < bVar211) * bVar211 | (bVar213 >= bVar211) * bVar213;
  bVar372 = (bVar214 < bVar343) * bVar343 | (bVar214 >= bVar343) * bVar214;
  bVar373 = (bVar216 < bVar352) * bVar352 | (bVar216 >= bVar352) * bVar216;
  bVar377 = (bVar379 < bVar212) * bVar212 | (bVar379 >= bVar212) * bVar379;
  bVar378 = (bVar384 < bVar213) * bVar213 | (bVar384 >= bVar213) * bVar384;
  bVar383 = (bVar386 < bVar214) * bVar214 | (bVar386 >= bVar214) * bVar386;
  bVar385 = (bVar391 < bVar216) * bVar216 | (bVar391 >= bVar216) * bVar391;
  bVar379 = (bVar379 != 0) * bVar379;
  bVar384 = (bVar384 != 0) * bVar384;
  bVar386 = (bVar386 != 0) * bVar386;
  bVar391 = (bVar391 != 0) * bVar391;
  bVar125 = *_limit;
  bVar151 = _limit[1];
  bVar154 = _limit[2];
  bVar157 = _limit[3];
  bVar344 = _limit[4];
  bVar213 = _limit[5];
  bVar214 = _limit[6];
  bVar216 = _limit[7];
  bVar196 = _limit[8];
  bVar209 = _limit[9];
  bVar210 = _limit[10];
  bVar211 = _limit[0xb];
  bVar212 = _limit[0xc];
  bVar343 = _limit[0xd];
  bVar352 = _limit[0xe];
  bVar353 = _limit[0xf];
  auVar351._0_4_ =
       CONCAT13(-((byte)((bVar363 < bVar157) * bVar363 | (bVar363 >= bVar157) * bVar157) == bVar363)
                ,CONCAT12(-((byte)((bVar362 < bVar154) * bVar362 | (bVar362 >= bVar154) * bVar154)
                           == bVar362),
                          CONCAT11(-((byte)((bVar358 < bVar151) * bVar358 |
                                           (bVar358 >= bVar151) * bVar151) == bVar358),
                                   -((byte)((bVar357 < bVar125) * bVar357 |
                                           (bVar357 >= bVar125) * bVar125) == bVar357))));
  auVar351[4] = -((byte)((bVar367 < bVar344) * bVar367 | (bVar367 >= bVar344) * bVar344) == bVar367)
  ;
  auVar351[5] = -((byte)((bVar368 < bVar213) * bVar368 | (bVar368 >= bVar213) * bVar213) == bVar368)
  ;
  auVar351[6] = -((byte)((bVar372 < bVar214) * bVar372 | (bVar372 >= bVar214) * bVar214) == bVar372)
  ;
  auVar351[7] = -((byte)((bVar373 < bVar216) * bVar373 | (bVar373 >= bVar216) * bVar216) == bVar373)
  ;
  auVar351[8] = -((byte)((bVar377 < bVar196) * bVar377 | (bVar377 >= bVar196) * bVar196) == bVar377)
  ;
  auVar351[9] = -((byte)((bVar378 < bVar209) * bVar378 | (bVar378 >= bVar209) * bVar209) == bVar378)
  ;
  auVar351[10] = -((byte)((bVar383 < bVar210) * bVar383 | (bVar383 >= bVar210) * bVar210) == bVar383
                  );
  auVar351[0xb] =
       -((byte)((bVar385 < bVar211) * bVar385 | (bVar385 >= bVar211) * bVar211) == bVar385);
  auVar351[0xc] =
       -((byte)((bVar379 < bVar212) * bVar379 | (bVar379 >= bVar212) * bVar212) == bVar379);
  auVar351[0xd] =
       -((byte)((bVar384 < bVar343) * bVar384 | (bVar384 >= bVar343) * bVar343) == bVar384);
  auVar351[0xe] =
       -((byte)((bVar386 < bVar352) * bVar386 | (bVar386 >= bVar352) * bVar352) == bVar386);
  auVar351[0xf] =
       -((byte)((bVar391 < bVar353) * bVar391 | (bVar391 >= bVar353) * bVar353) == bVar391);
  auVar132 = psubsb(auVar228 ^ _DAT_00427ee0,auVar321 ^ _DAT_00427ee0);
  uVar194 = (undefined4)
            (CONCAT17(-((byte)((bVar166 < bVar317) * bVar166 | (bVar166 >= bVar317) * bVar317) ==
                       bVar166),
                      CONCAT16(-((byte)((bVar164 < bVar316) * bVar164 |
                                       (bVar164 >= bVar316) * bVar316) == bVar164),
                               CONCAT15(-((byte)((bVar162 < bVar315) * bVar162 |
                                                (bVar162 >= bVar315) * bVar315) == bVar162),
                                        CONCAT14(-((byte)((bVar160 < bVar314) * bVar160 |
                                                         (bVar160 >= bVar314) * bVar314) == bVar160)
                                                 ,uVar127)))) >> 0x20);
  auVar252._4_4_ = uVar127;
  auVar252._0_4_ = uVar127;
  auVar252._8_4_ = uVar194;
  auVar252._12_4_ = uVar194;
  auVar250 = psubsb(~auVar252 & auVar132 >> 0x20,auVar132);
  auVar250 = psubsb(auVar250,auVar132);
  auVar250 = psubsb(auVar250,auVar132);
  auVar250 = auVar250 & auVar351;
  auVar254._0_4_ = auVar250._0_4_;
  auVar251._4_4_ = auVar254._0_4_;
  auVar251._0_4_ = auVar254._0_4_;
  auVar251._8_4_ = auVar250._4_4_;
  auVar251._12_4_ = auVar250._4_4_;
  auVar132 = paddsb(auVar251,_DAT_0046b070);
  auVar261._0_14_ = auVar250._0_14_;
  auVar261[0xe] = auVar250[7];
  auVar261[0xf] = auVar132[7];
  auVar260._14_2_ = auVar261._14_2_;
  auVar260._0_13_ = auVar250._0_13_;
  auVar260[0xd] = auVar132[6];
  auVar259._13_3_ = auVar260._13_3_;
  auVar259._0_12_ = auVar250._0_12_;
  auVar259[0xc] = auVar250[6];
  auVar258._12_4_ = auVar259._12_4_;
  auVar258._0_11_ = auVar250._0_11_;
  auVar258[0xb] = auVar132[5];
  auVar257._11_5_ = auVar258._11_5_;
  auVar257._0_10_ = auVar250._0_10_;
  auVar257[10] = auVar250[5];
  auVar256._10_6_ = auVar257._10_6_;
  auVar256._0_9_ = auVar250._0_9_;
  auVar256[9] = auVar132[4];
  auVar255._9_7_ = auVar256._9_7_;
  auVar255._0_8_ = auVar250._0_8_;
  auVar255[8] = auVar250[4];
  auVar254._8_8_ = auVar255._8_8_;
  auVar254[7] = auVar132[3];
  auVar254[6] = auVar250[3];
  auVar254[5] = auVar132[2];
  auVar254[4] = auVar250[2];
  auVar253._4_12_ = auVar254._4_12_;
  auVar253[3] = auVar132[1];
  auVar253[2] = auVar250[1];
  auVar253[0] = auVar250[0];
  auVar253[1] = auVar132[0];
  auVar132 = psraw(auVar253,0xb);
  auVar250 = packsswb(auVar132,auVar132);
  auVar288[0] = auVar250[0] + '\x01';
  cVar153 = auVar250[1] + '\x01';
  cVar156 = auVar250[2] + '\x01';
  cVar159 = auVar250[3] + '\x01';
  cVar161 = auVar250[4] + '\x01';
  cVar163 = auVar250[5] + '\x01';
  cVar165 = auVar250[6] + '\x01';
  cVar167 = auVar250[7] + '\x01';
  auVar288._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar167,cVar167),cVar165),
                                                     cVar165),cVar163),cVar163),cVar161),
                 CONCAT11(cVar161,cVar167)) >> 8);
  auVar288[7] = cVar159;
  auVar288[6] = cVar159;
  auVar288[5] = cVar156;
  auVar288[4] = cVar156;
  auVar288[3] = cVar153;
  auVar288[2] = cVar153;
  auVar288[1] = auVar288[0];
  auVar132 = psraw(auVar288,9);
  auVar132 = packsswb(auVar132,auVar132);
  uVar127 = auVar132._0_4_ & uVar127;
  auVar175._12_2_ = 0;
  auVar175._0_12_ = auVar4;
  auVar263._0_8_ = auVar250._0_8_;
  auVar263._8_4_ = auVar250._4_4_;
  auVar263._12_4_ = uVar127;
  auVar262._8_8_ = auVar263._8_8_;
  auVar262._0_4_ = auVar250._0_4_;
  auVar262._4_4_ = uVar127;
  auVar250 = psubsb(auVar321 ^ _DAT_00427ee0,auVar262);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = auVar262._8_8_;
  auVar132 = paddsb(auVar264,auVar228 ^ _DAT_00427ee0);
  auVar266._0_8_ = auVar132._0_8_;
  auVar266._8_4_ = auVar132._4_4_;
  auVar266._12_4_ = auVar250._4_4_;
  auVar265._8_8_ = auVar266._8_8_;
  auVar265._0_4_ = auVar132._0_4_;
  auVar265._4_4_ = auVar250._0_4_;
  auVar132 = psubusb(auVar342,auVar431);
  auVar250 = psubusb(auVar431,auVar342);
  auVar250 = auVar250 | auVar132;
  auVar132 = psubusb(auVar437,auVar431);
  auVar251 = psubusb(auVar431,auVar437);
  auVar251 = auVar251 | auVar132;
  bVar379 = auVar250[0];
  bVar384 = auVar251[0];
  bVar384 = (bVar384 < bVar379) * bVar379 | (bVar384 >= bVar379) * bVar384;
  bVar379 = auVar250[1];
  bVar386 = auVar251[1];
  bVar386 = (bVar386 < bVar379) * bVar379 | (bVar386 >= bVar379) * bVar386;
  bVar379 = auVar250[2];
  bVar391 = auVar251[2];
  bVar391 = (bVar391 < bVar379) * bVar379 | (bVar391 >= bVar379) * bVar391;
  bVar379 = auVar250[3];
  bVar125 = auVar251[3];
  bVar125 = (bVar125 < bVar379) * bVar379 | (bVar125 >= bVar379) * bVar125;
  bVar379 = auVar250[4];
  bVar151 = auVar251[4];
  bVar151 = (bVar151 < bVar379) * bVar379 | (bVar151 >= bVar379) * bVar151;
  bVar379 = auVar250[5];
  bVar154 = auVar251[5];
  bVar154 = (bVar154 < bVar379) * bVar379 | (bVar154 >= bVar379) * bVar154;
  bVar379 = auVar250[6];
  bVar157 = auVar251[6];
  bVar157 = (bVar157 < bVar379) * bVar379 | (bVar157 >= bVar379) * bVar157;
  bVar379 = auVar250[7];
  bVar344 = auVar251[7];
  bVar344 = (bVar344 < bVar379) * bVar379 | (bVar344 >= bVar379) * bVar344;
  uVar194 = auVar75._0_4_;
  bVar379 = (bVar384 < bVar310) * bVar310 | (bVar384 >= bVar310) * bVar384;
  bVar384 = (bVar386 < bVar311) * bVar311 | (bVar386 >= bVar311) * bVar386;
  bVar386 = (bVar391 < bVar312) * bVar312 | (bVar391 >= bVar312) * bVar391;
  bVar391 = (bVar125 < bVar313) * bVar313 | (bVar125 >= bVar313) * bVar125;
  bVar125 = (bVar151 < bVar433) * bVar433 | (bVar151 >= bVar433) * bVar151;
  bVar151 = (bVar154 < bVar152) * bVar152 | (bVar154 >= bVar152) * bVar154;
  bVar154 = (bVar157 < bVar155) * bVar155 | (bVar157 >= bVar155) * bVar157;
  bVar157 = (bVar344 < bVar158) * bVar158 | (bVar344 >= bVar158) * bVar344;
  bVar379 = (bVar125 < bVar379) * bVar379 | (bVar125 >= bVar379) * bVar125;
  bVar384 = (bVar151 < bVar384) * bVar384 | (bVar151 >= bVar384) * bVar151;
  bVar386 = (bVar154 < bVar386) * bVar386 | (bVar154 >= bVar386) * bVar154;
  bVar391 = (bVar157 < bVar391) * bVar391 | (bVar157 >= bVar391) * bVar157;
  auVar323._4_8_ = 0;
  auVar323._0_4_ = auVar395._12_4_;
  auVar323._12_4_ = uVar421;
  auVar322._8_8_ = auVar323._8_8_;
  auVar322._0_8_ = CONCAT44(uVar404,auVar395._12_4_);
  auVar410 = auVar322._0_14_;
  auVar249 = SUB1614(auVar265 ^ _DAT_00427ee0,0);
  uVar127 = CONCAT13(-((byte)((bVar391 == 0) * bVar391 | bVar391 != 0) == bVar391),
                     CONCAT12(-((byte)((bVar386 == 0) * bVar386 | bVar386 != 0) == bVar386),
                              CONCAT11(-((byte)((bVar384 == 0) * bVar384 | bVar384 != 0) == bVar384)
                                       ,-((byte)((bVar379 == 0) * bVar379 | bVar379 != 0) == bVar379
                                         )))) & auVar351._0_4_;
  auVar397._4_4_ = uVar127;
  auVar397._0_4_ = uVar127;
  auVar397._8_4_ = uVar127;
  auVar397._12_4_ = uVar127;
  cVar153 = (char)uVar127;
  auVar350[0] = -(cVar153 == '\0');
  cVar156 = (char)(uVar127 >> 8);
  auVar350[1] = -(cVar156 == '\0');
  cVar159 = (char)(uVar127 >> 0x10);
  auVar350[2] = -(cVar159 == '\0');
  cVar161 = (char)(uVar127 >> 0x18);
  auVar350[3] = -(cVar161 == '\0');
  auVar350[4] = -(cVar153 == '\0');
  auVar350[5] = -(cVar156 == '\0');
  auVar350[6] = -(cVar159 == '\0');
  auVar350[7] = -(cVar161 == '\0');
  auVar350[8] = -(cVar153 == '\0');
  auVar350[9] = -(cVar156 == '\0');
  auVar350[10] = -(cVar159 == '\0');
  auVar350[0xb] = -(cVar161 == '\0');
  auVar350[0xc] = -(cVar153 == '\0');
  auVar350[0xd] = -(cVar156 == '\0');
  auVar350[0xe] = -(cVar159 == '\0');
  auVar350[0xf] = -(cVar161 == '\0');
  uVar197 = SUB168(auVar265 ^ _DAT_00427ee0,8);
  auVar198._8_6_ = 0;
  auVar198._0_8_ = uVar197;
  if ((ushort)((ushort)(SUB161(auVar350 >> 7,0) & 1) | (ushort)(SUB161(auVar350 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar350 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar350 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar350 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar350 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar350 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar350 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar350 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar350 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar350 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar350 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar350 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar350 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar350 >> 0x77,0) & 1) << 0xe | (ushort)(auVar350[0xf] >> 7) << 0xf
              ) == 0xffff) {
    auVar64._4_4_ = uVar421;
    auVar64._0_4_ = uVar122;
    auVar64._8_4_ = auVar395._12_4_;
    auVar64._12_4_ = uVar428;
    auVar392 = auVar64._0_14_;
  }
  else {
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar431._0_13_;
    auVar5[0xe] = puVar2[8];
    uVar217 = auVar5._13_2_;
    auVar11[0xc] = auVar233[8];
    auVar11._0_12_ = auVar431._0_12_;
    auVar11._13_2_ = uVar217;
    auVar18[0xb] = 0;
    auVar18._0_11_ = auVar431._0_11_;
    auVar18._12_3_ = auVar11._12_3_;
    auVar25[10] = puVar1[8];
    auVar25._0_10_ = auVar431._0_10_;
    auVar25._11_4_ = auVar18._11_4_;
    auVar32[9] = 0;
    auVar32._0_9_ = auVar431._0_9_;
    auVar32._10_5_ = auVar25._10_5_;
    auVar39[8] = auVar117[8];
    auVar39._0_8_ = auVar431._0_8_;
    auVar39._9_6_ = auVar32._9_6_;
    auVar76._7_8_ = 0;
    auVar76._0_7_ = auVar39._8_7_;
    Var77 = CONCAT81(SUB158(auVar76 << 0x40,7),puVar2[7]);
    auVar106._9_6_ = 0;
    auVar106._0_9_ = Var77;
    auVar47[4] = auVar233[7];
    auVar47._0_4_ = uVar244;
    auVar47._5_10_ = SUB1510(auVar106 << 0x30,5);
    auVar78._11_4_ = 0;
    auVar78._0_11_ = auVar47._4_11_;
    auVar52[2] = puVar1[7];
    auVar52._0_2_ = auVar225._14_2_;
    auVar52._3_12_ = SUB1512(auVar78 << 0x20,3);
    uVar215 = auVar225._14_2_ & 0xff;
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar349._0_13_;
    auVar6[0xe] = puVar2[9];
    uVar339 = auVar6._13_2_;
    auVar12[0xc] = auVar233[9];
    auVar12._0_12_ = auVar347;
    auVar12._13_2_ = uVar339;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar347._0_11_;
    auVar19._12_3_ = auVar12._12_3_;
    auVar26[10] = puVar1[9];
    auVar26._0_10_ = auVar347._0_10_;
    auVar26._11_4_ = auVar19._11_4_;
    auVar33[9] = 0;
    auVar33._0_9_ = auVar347._0_9_;
    auVar33._10_5_ = auVar26._10_5_;
    auVar40[8] = auVar117[9];
    auVar40._0_8_ = auVar347._0_8_;
    auVar40._9_6_ = auVar33._9_6_;
    auVar79._7_8_ = 0;
    auVar79._0_7_ = auVar40._8_7_;
    Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),puVar2[6]);
    auVar107._9_6_ = 0;
    auVar107._0_9_ = Var80;
    auVar48[4] = auVar233[6];
    auVar48._0_4_ = uVar241;
    auVar48._5_10_ = SUB1510(auVar107 << 0x30,5);
    auVar81._11_4_ = 0;
    auVar81._0_11_ = auVar48._4_11_;
    auVar53[2] = puVar1[6];
    auVar53._0_2_ = uVar337;
    auVar53._3_12_ = SUB1512(auVar81 << 0x20,3);
    uVar337 = uVar337 & 0xff;
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar342._0_13_;
    auVar7[0xe] = puVar2[10];
    uVar195 = auVar7._13_2_;
    auVar13[0xc] = auVar233[10];
    auVar13._0_12_ = auVar341;
    auVar13._13_2_ = uVar195;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar341._0_11_;
    auVar20._12_3_ = auVar13._12_3_;
    auVar27[10] = puVar1[10];
    auVar27._0_10_ = auVar341._0_10_;
    auVar27._11_4_ = auVar20._11_4_;
    auVar34[9] = 0;
    auVar34._0_9_ = auVar341._0_9_;
    auVar34._10_5_ = auVar27._10_5_;
    auVar41[8] = auVar117[10];
    auVar41._0_8_ = auVar341._0_8_;
    auVar41._9_6_ = auVar34._9_6_;
    auVar82._7_8_ = 0;
    auVar82._0_7_ = auVar41._8_7_;
    Var83 = CONCAT81(SUB158(auVar82 << 0x40,7),puVar2[5]);
    auVar108._9_6_ = 0;
    auVar108._0_9_ = Var83;
    auVar49[4] = auVar233[5];
    auVar49._0_4_ = uVar238;
    auVar49._5_10_ = SUB1510(auVar108 << 0x30,5);
    auVar84._11_4_ = 0;
    auVar84._0_11_ = auVar49._4_11_;
    auVar54[2] = puVar1[5];
    auVar54._0_2_ = uVar193;
    auVar54._3_12_ = SUB1512(auVar84 << 0x20,3);
    uVar193 = uVar193 & 0xff;
    auVar8._12_2_ = 0;
    auVar8._0_12_ = auVar4;
    auVar8[0xe] = puVar2[0xb];
    uVar451 = auVar8._13_2_;
    auVar14[0xc] = auVar233[0xb];
    auVar14._0_12_ = auVar4;
    auVar14._13_2_ = uVar451;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar4._0_11_;
    auVar21._12_3_ = auVar14._12_3_;
    auVar28[10] = puVar1[0xb];
    auVar28._0_10_ = auVar4._0_10_;
    auVar28._11_4_ = auVar21._11_4_;
    auVar35[9] = 0;
    auVar35._0_9_ = auVar4._0_9_;
    auVar35._10_5_ = auVar28._10_5_;
    auVar42[8] = auVar117[0xb];
    auVar42._0_8_ = uVar129;
    auVar42._9_6_ = auVar35._9_6_;
    auVar85._7_8_ = 0;
    auVar85._0_7_ = auVar42._8_7_;
    Var86 = CONCAT81(SUB158(auVar85 << 0x40,7),puVar2[4]);
    auVar109._9_6_ = 0;
    auVar109._0_9_ = Var86;
    auVar50[4] = auVar233[4];
    auVar50._0_4_ = uVar218;
    auVar50._5_10_ = SUB1510(auVar109 << 0x30,5);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar50._4_11_;
    auVar55[2] = puVar1[4];
    auVar55._0_2_ = uVar173;
    auVar55._3_12_ = SUB1512(auVar87 << 0x20,3);
    uVar173 = uVar173 & 0xff;
    sVar118 = auVar53._2_2_;
    sVar354 = auVar54._2_2_;
    sVar119 = auVar48._4_2_;
    sVar359 = auVar49._4_2_;
    sVar120 = (short)Var80;
    sVar364 = (short)Var83;
    sVar121 = auVar40._8_2_;
    sVar369 = auVar41._8_2_;
    sVar123 = auVar26._10_2_;
    sVar374 = auVar27._10_2_;
    sVar124 = auVar12._12_2_;
    sVar380 = auVar13._12_2_;
    sVar387 = (uVar195 >> 8) + (uVar339 >> 8);
    sVar345 = uVar193 + uVar337 + uVar215;
    sVar445 = auVar52._2_2_;
    sVar355 = sVar354 + sVar118 + sVar445;
    sVar446 = auVar47._4_2_;
    sVar360 = sVar359 + sVar119 + sVar446;
    sVar447 = (short)Var77;
    sVar365 = sVar364 + sVar120 + sVar447;
    sVar448 = auVar39._8_2_;
    sVar370 = sVar369 + sVar121 + sVar448;
    sVar449 = auVar25._10_2_;
    sVar375 = sVar374 + sVar123 + sVar449;
    sVar450 = auVar11._12_2_;
    sVar381 = sVar380 + sVar124 + sVar450;
    sVar388 = sVar387 + (uVar217 >> 8);
    sVar400 = sVar370 + sVar345 + 4;
    sVar413 = sVar375 + sVar355 + 4;
    sVar417 = sVar381 + sVar360 + 4;
    sVar422 = sVar388 + sVar365 + 4;
    auVar175 = auVar397._0_14_;
    sVar275 = auVar55._2_2_;
    sVar277 = auVar50._4_2_;
    sVar279 = (short)Var86;
    sVar281 = auVar42._8_2_;
    sVar283 = auVar28._10_2_;
    sVar285 = auVar14._12_2_;
    auVar115._8_6_ = 0;
    auVar115._0_8_ = uVar197;
    sVar423 = sVar422 - (uVar195 >> 8);
    auVar132 = psubusb(auVar322,auVar431);
    auVar250 = psubusb(auVar431,auVar322);
    auVar250 = auVar250 | auVar132;
    auVar62._8_4_ = auVar395._12_4_;
    auVar62._0_8_ = CONCAT44(uVar421,uVar122);
    auVar61._12_4_ = uVar428;
    auVar61._0_12_ = auVar62;
    auVar392 = auVar61._0_14_;
    auVar132 = psubusb(auVar61,auVar431);
    auVar251 = psubusb(auVar431,auVar61);
    auVar251 = auVar251 | auVar132;
    bVar379 = auVar250[0];
    bVar384 = auVar251[0];
    bVar384 = (bVar384 < bVar379) * bVar379 | (bVar384 >= bVar379) * bVar384;
    bVar379 = auVar250[1];
    bVar386 = auVar251[1];
    bVar386 = (bVar386 < bVar379) * bVar379 | (bVar386 >= bVar379) * bVar386;
    bVar379 = auVar250[2];
    bVar391 = auVar251[2];
    bVar391 = (bVar391 < bVar379) * bVar379 | (bVar391 >= bVar379) * bVar391;
    bVar379 = auVar250[3];
    bVar125 = auVar251[3];
    bVar125 = (bVar125 < bVar379) * bVar379 | (bVar125 >= bVar379) * bVar125;
    bVar379 = auVar250[4];
    bVar151 = auVar251[4];
    bVar151 = (bVar151 < bVar379) * bVar379 | (bVar151 >= bVar379) * bVar151;
    bVar379 = auVar250[5];
    bVar154 = auVar251[5];
    bVar154 = (bVar154 < bVar379) * bVar379 | (bVar154 >= bVar379) * bVar154;
    bVar379 = auVar250[6];
    bVar157 = auVar251[6];
    bVar157 = (bVar157 < bVar379) * bVar379 | (bVar157 >= bVar379) * bVar157;
    bVar379 = auVar250[7];
    bVar310 = auVar251[7];
    bVar310 = (bVar310 < bVar379) * bVar379 | (bVar310 >= bVar379) * bVar310;
    bVar379 = auVar250[8];
    bVar344 = auVar251[8];
    bVar344 = (bVar344 < bVar379) * bVar379 | (bVar344 >= bVar379) * bVar344;
    bVar379 = auVar250[9];
    bVar311 = auVar251[9];
    bVar311 = (bVar311 < bVar379) * bVar379 | (bVar311 >= bVar379) * bVar311;
    bVar379 = auVar250[10];
    bVar312 = auVar251[10];
    bVar312 = (bVar312 < bVar379) * bVar379 | (bVar312 >= bVar379) * bVar312;
    bVar379 = auVar250[0xb];
    bVar313 = auVar251[0xb];
    bVar313 = (bVar313 < bVar379) * bVar379 | (bVar313 >= bVar379) * bVar313;
    bVar379 = auVar250[0xc];
    bVar314 = auVar251[0xc];
    bVar314 = (bVar314 < bVar379) * bVar379 | (bVar314 >= bVar379) * bVar314;
    bVar379 = auVar250[0xd];
    bVar315 = auVar251[0xd];
    bVar315 = (bVar315 < bVar379) * bVar379 | (bVar315 >= bVar379) * bVar315;
    bVar379 = auVar250[0xe];
    bVar316 = auVar251[0xe];
    bVar317 = auVar251[0xf];
    bVar316 = (bVar316 < bVar379) * bVar379 | (bVar316 >= bVar379) * bVar316;
    bVar379 = auVar250[0xf];
    bVar317 = (bVar317 < bVar379) * bVar379 | (bVar317 >= bVar379) * bVar317;
    auVar65._4_4_ = uVar428;
    auVar65._0_4_ = uVar194;
    auVar65._8_4_ = uVar122;
    auVar65._12_4_ = uVar429;
    auVar132 = psubusb(auVar65,auVar431);
    auVar250 = psubusb(auVar431,auVar65);
    auVar250 = auVar250 | auVar132;
    bVar379 = auVar250[0];
    bVar213 = (bVar379 < bVar384) * bVar384 | (bVar379 >= bVar384) * bVar379;
    bVar379 = auVar250[1];
    bVar214 = (bVar379 < bVar386) * bVar386 | (bVar379 >= bVar386) * bVar379;
    bVar379 = auVar250[2];
    bVar216 = (bVar379 < bVar391) * bVar391 | (bVar379 >= bVar391) * bVar379;
    bVar379 = auVar250[3];
    bVar196 = (bVar379 < bVar125) * bVar125 | (bVar379 >= bVar125) * bVar379;
    bVar379 = auVar250[4];
    bVar209 = (bVar379 < bVar151) * bVar151 | (bVar379 >= bVar151) * bVar379;
    bVar379 = auVar250[5];
    bVar210 = (bVar379 < bVar154) * bVar154 | (bVar379 >= bVar154) * bVar379;
    bVar379 = auVar250[6];
    bVar211 = (bVar379 < bVar157) * bVar157 | (bVar379 >= bVar157) * bVar379;
    bVar379 = auVar250[7];
    bVar212 = (bVar379 < bVar310) * bVar310 | (bVar379 >= bVar310) * bVar379;
    bVar379 = auVar250[8];
    bVar343 = (bVar379 < bVar344) * bVar344 | (bVar379 >= bVar344) * bVar379;
    bVar379 = auVar250[9];
    bVar352 = (bVar379 < bVar311) * bVar311 | (bVar379 >= bVar311) * bVar379;
    bVar379 = auVar250[10];
    bVar353 = (bVar379 < bVar312) * bVar312 | (bVar379 >= bVar312) * bVar379;
    bVar379 = auVar250[0xb];
    bVar433 = (bVar379 < bVar313) * bVar313 | (bVar379 >= bVar313) * bVar379;
    bVar379 = auVar250[0xc];
    bVar384 = (bVar379 < bVar314) * bVar314 | (bVar379 >= bVar314) * bVar379;
    bVar379 = auVar250[0xd];
    bVar379 = (bVar379 < bVar315) * bVar315 | (bVar379 >= bVar315) * bVar379;
    bVar386 = auVar250[0xe];
    bVar391 = auVar250[0xf];
    bVar386 = (bVar386 < bVar316) * bVar316 | (bVar386 >= bVar316) * bVar386;
    bVar391 = (bVar391 < bVar317) * bVar317 | (bVar391 >= bVar317) * bVar391;
    bVar125 = (bVar209 < bVar213) * bVar213 | (bVar209 >= bVar213) * bVar209;
    bVar151 = (bVar210 < bVar214) * bVar214 | (bVar210 >= bVar214) * bVar210;
    bVar154 = (bVar211 < bVar216) * bVar216 | (bVar211 >= bVar216) * bVar211;
    bVar157 = (bVar212 < bVar196) * bVar196 | (bVar212 >= bVar196) * bVar212;
    bVar310 = (bVar343 < bVar209) * bVar209 | (bVar343 >= bVar209) * bVar343;
    bVar344 = (bVar352 < bVar210) * bVar210 | (bVar352 >= bVar210) * bVar352;
    bVar311 = (bVar353 < bVar211) * bVar211 | (bVar353 >= bVar211) * bVar353;
    bVar312 = (bVar433 < bVar212) * bVar212 | (bVar433 >= bVar212) * bVar433;
    bVar313 = (bVar384 < bVar343) * bVar343 | (bVar384 >= bVar343) * bVar384;
    bVar314 = (bVar379 < bVar352) * bVar352 | (bVar379 >= bVar352) * bVar379;
    bVar315 = (bVar386 < bVar353) * bVar353 | (bVar386 >= bVar353) * bVar386;
    bVar316 = (bVar391 < bVar433) * bVar433 | (bVar391 >= bVar433) * bVar391;
    bVar384 = (bVar384 != 0) * bVar384;
    bVar379 = (bVar379 != 0) * bVar379;
    bVar386 = (bVar386 != 0) * bVar386;
    bVar391 = (bVar391 != 0) * bVar391;
    auVar289[0] = -((byte)((bVar125 == 0) * bVar125 | bVar125 != 0) == bVar125);
    auVar289[1] = -((byte)((bVar151 == 0) * bVar151 | bVar151 != 0) == bVar151);
    auVar289[2] = -((byte)((bVar154 == 0) * bVar154 | bVar154 != 0) == bVar154);
    auVar289[3] = -((byte)((bVar157 == 0) * bVar157 | bVar157 != 0) == bVar157);
    auVar289[4] = -((byte)((bVar310 == 0) * bVar310 | bVar310 != 0) == bVar310);
    auVar289[5] = -((byte)((bVar344 == 0) * bVar344 | bVar344 != 0) == bVar344);
    auVar289[6] = -((byte)((bVar311 == 0) * bVar311 | bVar311 != 0) == bVar311);
    auVar289[7] = -((byte)((bVar312 == 0) * bVar312 | bVar312 != 0) == bVar312);
    auVar289[8] = -((byte)((bVar313 == 0) * bVar313 | bVar313 != 0) == bVar313);
    auVar289[9] = -((byte)((bVar314 == 0) * bVar314 | bVar314 != 0) == bVar314);
    auVar289[10] = -((byte)((bVar315 == 0) * bVar315 | bVar315 != 0) == bVar315);
    auVar289[0xb] = -((byte)((bVar316 == 0) * bVar316 | bVar316 != 0) == bVar316);
    auVar289[0xc] = -((byte)((bVar384 == 0) * bVar384 | bVar384 != 0) == bVar384);
    auVar289[0xd] = -((byte)((bVar379 == 0) * bVar379 | bVar379 != 0) == bVar379);
    auVar289[0xe] = -((byte)((bVar386 == 0) * bVar386 | bVar386 != 0) == bVar386);
    auVar289[0xf] = -((byte)((bVar391 == 0) * bVar391 | bVar391 != 0) == bVar391);
    uVar246 = (ushort)(uVar173 + uVar215 + sVar400) >> 3;
    uVar276 = (ushort)(sVar275 + sVar445 + sVar413) >> 3;
    uVar278 = (ushort)(sVar277 + sVar446 + sVar417) >> 3;
    uVar280 = (ushort)(sVar279 + sVar447 + sVar422) >> 3;
    uVar282 = (ushort)(sVar281 + sVar448 + sVar400) >> 3;
    uVar284 = (ushort)(sVar283 + sVar449 + sVar413) >> 3;
    uVar286 = (ushort)(sVar285 + sVar450 + sVar417) >> 3;
    uVar287 = (ushort)((uVar451 >> 8) + (uVar217 >> 8) + sVar422) >> 3;
    auVar248[1] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar248[0] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar248[2] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar248[3] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar248[4] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar248[5] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar248[6] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
    auVar248[7] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
    auVar248[8] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar248[9] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar248[10] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar248[0xb] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar248[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar248[0xd] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar249 = auVar248 & auVar175 | ~auVar175 & auVar249;
    uVar246 = (ushort)((sVar400 - sVar369) + uVar173 * 2 + uVar337) >> 3;
    uVar276 = (ushort)((sVar413 - sVar374) + sVar275 * 2 + sVar118) >> 3;
    uVar278 = (ushort)((sVar417 - sVar380) + sVar277 * 2 + sVar119) >> 3;
    uVar280 = (ushort)(sVar423 + sVar279 * 2 + sVar120) >> 3;
    uVar282 = (ushort)((sVar400 - uVar193) + sVar281 * 2 + sVar121) >> 3;
    uVar284 = (ushort)((sVar413 - sVar354) + sVar283 * 2 + sVar123) >> 3;
    uVar286 = (ushort)((sVar417 - sVar359) + sVar285 * 2 + sVar124) >> 3;
    uVar287 = (ushort)((sVar422 - sVar364) + (uVar451 >> 8) * 2 + (uVar339 >> 8)) >> 3;
    auVar348[1] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar348[0] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar348[2] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar348[3] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar348[4] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar348[5] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar348[6] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
    auVar348[7] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
    auVar348[8] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar348[9] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar348[10] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar348[0xb] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar348[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar348[0xd] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar198 = auVar348 & auVar175 | ~auVar175 & auVar115;
    uVar246 = (ushort)(((uVar173 * 3 + uVar193) - sVar121) + (sVar400 - sVar369)) >> 3;
    uVar276 = (ushort)(((sVar275 * 3 + sVar354) - sVar123) + (sVar413 - sVar374)) >> 3;
    uVar278 = (ushort)(((sVar277 * 3 + sVar359) - sVar124) + (sVar417 - sVar380)) >> 3;
    uVar280 = (ushort)(((sVar279 * 3 + sVar364) - (uVar339 >> 8)) + sVar423) >> 3;
    uVar282 = (ushort)(((sVar281 * 3 + sVar369) - uVar337) + (sVar400 - uVar193)) >> 3;
    uVar284 = (ushort)(((sVar283 * 3 + sVar374) - sVar118) + (sVar413 - sVar354)) >> 3;
    uVar286 = (ushort)(((sVar285 * 3 + sVar380) - sVar119) + (sVar417 - sVar359)) >> 3;
    uVar287 = (ushort)((((uVar451 >> 8) * 3 + (uVar195 >> 8)) - sVar120) + (sVar422 - sVar364)) >> 3
    ;
    auVar434[1] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar434[0] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar434[2] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar434[3] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar434[4] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar434[5] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar434[6] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
    auVar434[7] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
    auVar434[8] = (uVar246 != 0) * (uVar246 < 0x100) * (char)uVar246 - (0xff < uVar246);
    auVar434[9] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar434[10] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar434[0xb] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar434[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar434[0xd] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar289 = auVar289 & auVar397;
    auVar435 = auVar434 & auVar175 | ~auVar175 & auVar435;
    auVar398._4_4_ = auVar289._0_4_;
    auVar398._0_4_ = auVar289._0_4_;
    auVar398._8_4_ = auVar289._4_4_;
    auVar398._12_4_ = auVar289._4_4_;
    auVar183[0] = -(auVar289[0] == '\0');
    auVar183[1] = -(auVar289[1] == '\0');
    auVar183[2] = -(auVar289[2] == '\0');
    auVar183[3] = -(auVar289[3] == '\0');
    auVar183[4] = -(auVar289[0] == '\0');
    auVar183[5] = -(auVar289[1] == '\0');
    auVar183[6] = -(auVar289[2] == '\0');
    auVar183[7] = -(auVar289[3] == '\0');
    auVar183[8] = -(auVar289[4] == '\0');
    auVar183[9] = -(auVar289[5] == '\0');
    auVar183[10] = -(auVar289[6] == '\0');
    auVar183[0xb] = -(auVar289[7] == '\0');
    auVar183[0xc] = -(auVar289[4] == '\0');
    auVar183[0xd] = -(auVar289[5] == '\0');
    auVar183[0xe] = -(auVar289[6] == '\0');
    auVar183[0xf] = -(auVar289[7] == '\0');
    if ((ushort)((ushort)(SUB161(auVar183 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar183 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar183 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar183 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar183 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar183 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar183 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar183 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar183 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar183 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar183 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar183 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar183 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar183 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar183 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar183[0xf] >> 7) << 0xf) == 0xffff) {
      auVar175._12_2_ = 0;
    }
    else {
      auVar67._8_4_ = uVar122;
      auVar67._0_8_ = CONCAT44(uVar428,uVar194);
      auVar66._12_4_ = uVar429;
      auVar66._0_12_ = auVar67;
      auVar15[0xd] = 0;
      auVar15._0_13_ = auVar66._0_13_;
      auVar15[0xe] = uVar60;
      auVar22[0xc] = uVar171;
      auVar22._0_12_ = auVar67;
      auVar22._13_2_ = auVar15._13_2_;
      auVar29[0xb] = 0;
      auVar29._0_11_ = auVar67._0_11_;
      auVar29._12_3_ = auVar22._12_3_;
      auVar36[10] = uVar58;
      auVar36._0_10_ = auVar67._0_10_;
      auVar36._11_4_ = auVar29._11_4_;
      auVar43[9] = 0;
      auVar43._0_9_ = auVar67._0_9_;
      auVar43._10_5_ = auVar36._10_5_;
      auVar46[8] = uVar430;
      auVar46._0_8_ = CONCAT44(uVar428,uVar194);
      auVar46._9_6_ = auVar43._9_6_;
      auVar88._7_8_ = 0;
      auVar88._0_7_ = auVar46._8_7_;
      Var77 = CONCAT81(SUB158(auVar88 << 0x40,7),uVar59);
      auVar110._9_6_ = 0;
      auVar110._0_9_ = Var77;
      auVar89._1_10_ = SUB1510(auVar110 << 0x30,5);
      auVar89[0] = uVar208;
      auVar111._11_4_ = 0;
      auVar111._0_11_ = auVar89;
      auVar90._1_12_ = SUB1512(auVar111 << 0x20,3);
      auVar90[0] = uVar57;
      auVar184._0_2_ = auVar70._0_2_ & 0xff;
      auVar184._2_13_ = auVar90;
      auVar184[0xf] = 0;
      sVar400 = auVar90._0_2_;
      sVar413 = auVar89._0_2_;
      sVar417 = (short)Var77;
      sVar422 = auVar46._8_2_;
      sVar423 = auVar36._10_2_;
      sVar169 = auVar22._12_2_;
      uVar278 = auVar15._13_2_ >> 8;
      auVar70 = auVar398._0_14_;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar322._0_13_;
      auVar9[0xe] = puVar2[0xc];
      uVar246 = auVar9._13_2_;
      auVar16[0xc] = auVar233[0xc];
      auVar16._0_12_ = auVar322._0_12_;
      auVar16._13_2_ = uVar246;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar322._0_11_;
      auVar23._12_3_ = auVar16._12_3_;
      auVar30[10] = puVar1[0xc];
      auVar30._0_10_ = auVar322._0_10_;
      auVar30._11_4_ = auVar23._11_4_;
      auVar37[9] = 0;
      auVar37._0_9_ = auVar322._0_9_;
      auVar37._10_5_ = auVar30._10_5_;
      auVar44[8] = auVar117[0xc];
      auVar44._0_8_ = auVar322._0_8_;
      auVar44._9_6_ = auVar37._9_6_;
      auVar91._7_8_ = 0;
      auVar91._0_7_ = auVar44._8_7_;
      Var77 = CONCAT81(SUB158(auVar91 << 0x40,7),puVar2[3]);
      auVar112._9_6_ = 0;
      auVar112._0_9_ = Var77;
      auVar51[4] = auVar233[3];
      auVar51._0_4_ = auVar395._12_4_;
      auVar51._5_10_ = SUB1510(auVar112 << 0x30,5);
      auVar92._11_4_ = 0;
      auVar92._0_11_ = auVar51._4_11_;
      auVar56[2] = puVar1[3];
      auVar56._0_2_ = uVar334;
      auVar56._3_12_ = SUB1512(auVar92 << 0x20,3);
      uVar334 = uVar334 & 0xff;
      auVar10[0xd] = 0;
      auVar10._0_13_ = auVar61._0_13_;
      auVar10[0xe] = puVar2[0xd];
      uVar276 = auVar10._13_2_;
      auVar17[0xc] = auVar233[0xd];
      auVar17._0_12_ = auVar62;
      auVar17._13_2_ = uVar276;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar62._0_11_;
      auVar24._12_3_ = auVar17._12_3_;
      auVar31[10] = puVar1[0xd];
      auVar31._0_10_ = auVar62._0_10_;
      auVar31._11_4_ = auVar24._11_4_;
      auVar38[9] = 0;
      auVar38._0_9_ = auVar62._0_9_;
      auVar38._10_5_ = auVar31._10_5_;
      auVar45[8] = auVar117[0xd];
      auVar45._0_8_ = CONCAT44(uVar421,uVar122);
      auVar45._9_6_ = auVar38._9_6_;
      auVar93._7_8_ = 0;
      auVar93._0_7_ = auVar45._8_7_;
      Var80 = CONCAT81(SUB158(auVar93 << 0x40,7),puVar2[2]);
      auVar113._9_6_ = 0;
      auVar113._0_9_ = Var80;
      auVar94._1_10_ = SUB1510(auVar113 << 0x30,5);
      auVar94[0] = auVar233[2];
      auVar114._11_4_ = 0;
      auVar114._0_11_ = auVar94;
      auVar95._1_12_ = SUB1512(auVar114 << 0x20,3);
      auVar95[0] = puVar1[2];
      uVar318 = auVar71._0_2_ & 0xff;
      sVar236 = auVar56._2_2_;
      sVar237 = auVar51._4_2_;
      sVar239 = (short)Var77;
      sVar240 = auVar44._8_2_;
      sVar242 = auVar30._10_2_;
      sVar243 = auVar16._12_2_;
      sVar245 = (uVar246 >> 8) + (uVar451 >> 8);
      sVar346 = uVar334 + uVar173 + uVar318;
      sVar332 = auVar95._0_2_;
      sVar356 = sVar236 + sVar275 + sVar332;
      sVar333 = auVar94._0_2_;
      sVar361 = sVar237 + sVar277 + sVar333;
      sVar335 = (short)Var80;
      sVar366 = sVar239 + sVar279 + sVar335;
      sVar336 = auVar45._8_2_;
      sVar371 = sVar240 + sVar281 + sVar336;
      sVar338 = auVar31._10_2_;
      sVar376 = sVar242 + sVar283 + sVar338;
      sVar340 = auVar17._12_2_;
      sVar382 = sVar243 + sVar285 + sVar340;
      sVar389 = sVar245 + (uVar276 >> 8);
      sVar345 = sVar370 + sVar371 + sVar345 + sVar346 + 8;
      sVar370 = sVar375 + sVar376 + sVar355 + sVar356 + 8;
      sVar302 = sVar381 + sVar382 + sVar360 + sVar361 + 8;
      sVar306 = sVar388 + sVar389 + sVar365 + sVar366 + 8;
      sVar424 = sVar306 - (uVar276 >> 8);
      sVar355 = (sVar345 - uVar318) - uVar334;
      sVar375 = (sVar370 - sVar332) - sVar236;
      sVar303 = (sVar302 - sVar333) - sVar237;
      sVar307 = (sVar306 - sVar335) - sVar239;
      sVar401 = (sVar345 - sVar336) - sVar240;
      sVar414 = (sVar370 - sVar338) - sVar242;
      sVar418 = (sVar302 - sVar340) - sVar243;
      sVar425 = sVar424 - (uVar246 >> 8);
      sVar402 = sVar401 - sVar281;
      sVar415 = sVar414 - sVar283;
      sVar419 = sVar418 - sVar285;
      sVar426 = sVar425 - (uVar451 >> 8);
      sVar360 = sVar355 - uVar173;
      sVar381 = sVar375 - sVar275;
      sVar304 = sVar303 - sVar277;
      sVar308 = sVar307 - sVar279;
      auVar132 = psllw(auVar184,2);
      auVar392._12_2_ = 0;
      auVar392._0_12_ = auVar4;
      sVar403 = sVar402 - sVar369;
      sVar416 = sVar415 - sVar374;
      sVar420 = sVar419 - sVar380;
      sVar427 = sVar426 - (uVar195 >> 8);
      sVar365 = sVar360 - uVar193;
      sVar388 = sVar381 - sVar354;
      sVar305 = sVar304 - sVar359;
      sVar309 = sVar308 - sVar364;
      uVar280 = (ushort)(sVar448 + auVar184._0_2_ + uVar215 + uVar337 + sVar345) >> 4;
      uVar282 = (ushort)(sVar449 + sVar400 + sVar445 + sVar118 + sVar370) >> 4;
      uVar284 = (ushort)(sVar450 + sVar413 + sVar446 + sVar119 + sVar302) >> 4;
      uVar286 = (ushort)((uVar217 >> 8) + sVar417 + sVar447 + sVar120 + sVar306) >> 4;
      uVar287 = (ushort)(sVar422 + sVar448 + sVar121 + uVar215 + sVar345) >> 4;
      uVar168 = (ushort)(sVar423 + sVar449 + sVar123 + sVar445 + sVar370) >> 4;
      uVar170 = (ushort)(sVar169 + sVar450 + sVar124 + sVar446 + sVar302) >> 4;
      uVar172 = (ushort)(uVar278 + (uVar217 >> 8) + (uVar339 >> 8) + sVar447 + sVar306) >> 4;
      auVar131[1] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar131[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar131[2] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar131[3] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar131[4] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar131[5] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      auVar131[6] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
      auVar131[7] = (uVar172 != 0) * (uVar172 < 0x100) * (char)uVar172 - (0xff < uVar172);
      auVar131[8] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar131[9] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar131[10] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar131[0xb] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar131[0xc] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar131[0xd] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      auVar249 = auVar131 & auVar70 | ~auVar70 & auVar249;
      uVar280 = (ushort)((sVar345 - sVar336) + uVar337 + uVar215 + uVar193 + auVar184._0_2_ * 2) >>
                4;
      uVar282 = (ushort)((sVar370 - sVar338) + sVar118 + sVar445 + sVar354 + sVar400 * 2) >> 4;
      uVar284 = (ushort)((sVar302 - sVar340) + sVar119 + sVar446 + sVar359 + sVar413 * 2) >> 4;
      uVar286 = (ushort)(sVar424 + sVar120 + sVar447 + sVar364 + sVar417 * 2) >> 4;
      uVar287 = (ushort)((sVar345 - uVar318) + sVar121 + sVar448 + sVar369 + sVar422 * 2) >> 4;
      uVar215 = (ushort)((sVar370 - sVar332) + sVar123 + sVar449 + sVar374 + sVar423 * 2) >> 4;
      uVar168 = (ushort)((sVar302 - sVar333) + sVar124 + sVar450 + sVar380 + sVar169 * 2) >> 4;
      uVar217 = (ushort)((sVar306 - sVar335) +
                        (uVar339 >> 8) + (uVar217 >> 8) + (uVar195 >> 8) + uVar278 * 2) >> 4;
      auVar199[1] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar199[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar199[2] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar199[3] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar199[4] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar199[5] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      auVar199[6] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      auVar199[7] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar199[8] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar199[9] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar199[10] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar199[0xb] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar199[0xc] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar199[0xd] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      auVar198 = auVar199 & auVar70 | ~auVar70 & auVar198;
      uVar217 = (ushort)(sVar401 + uVar193 + uVar337 + uVar173 + auVar184._0_2_ * 3) >> 4;
      uVar280 = (ushort)(sVar414 + sVar354 + sVar118 + sVar275 + sVar400 * 3) >> 4;
      uVar282 = (ushort)(sVar418 + sVar359 + sVar119 + sVar277 + sVar413 * 3) >> 4;
      uVar284 = (ushort)(sVar425 + sVar364 + sVar120 + sVar279 + sVar417 * 3) >> 4;
      uVar286 = (ushort)(sVar355 + sVar369 + sVar121 + sVar281 + sVar422 * 3) >> 4;
      uVar287 = (ushort)(sVar375 + sVar374 + sVar123 + sVar283 + sVar423 * 3) >> 4;
      uVar215 = (ushort)(sVar303 + sVar380 + sVar124 + sVar285 + sVar169 * 3) >> 4;
      uVar451 = (ushort)(sVar307 + sVar387 + (uVar451 >> 8) + uVar278 * 3) >> 4;
      auVar436[1] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar436[0] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar436[2] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar436[3] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar436[4] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar436[5] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar436[6] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      auVar436[7] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar436[8] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar436[9] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar436[10] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar436[0xb] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar436[0xc] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar436[0xd] = (uVar287 != 0) * (uVar287 < 0x100) * (char)uVar287 - (0xff < uVar287);
      auVar435 = auVar436 & auVar70 | ~auVar70 & auVar435;
      uVar173 = (ushort)(sVar402 + uVar334 + uVar173 + uVar193 + auVar132._0_2_) >> 4;
      uVar193 = (ushort)(sVar415 + sVar236 + sVar275 + sVar354 + auVar132._2_2_) >> 4;
      uVar217 = (ushort)(sVar419 + sVar237 + sVar277 + sVar359 + auVar132._4_2_) >> 4;
      uVar451 = (ushort)(sVar426 + sVar239 + sVar279 + sVar364 + auVar132._6_2_) >> 4;
      uVar280 = (ushort)(sVar360 + sVar240 + sVar281 + sVar369 + auVar132._8_2_) >> 4;
      uVar282 = (ushort)(sVar381 + sVar242 + sVar283 + sVar374 + auVar132._10_2_) >> 4;
      uVar284 = (ushort)(sVar304 + sVar243 + sVar285 + sVar380 + auVar132._12_2_) >> 4;
      uVar195 = (ushort)(sVar308 + sVar245 + (uVar195 >> 8) + auVar132._14_2_) >> 4;
      auVar174[1] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar174[0] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar174[2] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar174[3] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar174[4] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar174[5] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar174[6] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar174[7] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar174[8] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar174[9] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar174[10] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar174[0xb] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar174[0xc] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar174[0xd] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar175 = auVar174 & auVar70 | ~auVar70 & auVar392;
      uVar173 = (ushort)(sVar403 + auVar184._0_2_ * 5 + sVar346) >> 4;
      uVar193 = (ushort)(sVar416 + sVar400 * 5 + sVar356) >> 4;
      uVar217 = (ushort)(sVar420 + sVar413 * 5 + sVar361) >> 4;
      uVar195 = (ushort)(sVar427 + sVar417 * 5 + sVar366) >> 4;
      uVar451 = (ushort)(sVar365 + sVar422 * 5 + sVar371) >> 4;
      uVar280 = (ushort)(sVar388 + sVar423 * 5 + sVar376) >> 4;
      uVar282 = (ushort)(sVar305 + sVar169 * 5 + sVar382) >> 4;
      uVar284 = (ushort)(sVar309 + uVar278 * 5 + sVar389) >> 4;
      auVar409[1] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar409[0] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar409[2] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar409[3] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar409[4] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar409[5] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar409[6] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar409[7] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar409[8] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar409[9] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar409[10] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar409[0xb] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar409[0xc] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar409[0xd] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
      auVar410 = auVar409 & auVar70 | ~auVar70 & auVar410;
      uVar173 = (ushort)(((uVar318 + uVar334 + auVar184._0_2_ * 7) - sVar121) + sVar403) >> 4;
      uVar193 = (ushort)(((sVar332 + sVar236 + sVar400 * 7) - sVar123) + sVar416) >> 4;
      uVar334 = (ushort)(((sVar333 + sVar237 + sVar413 * 7) - sVar124) + sVar420) >> 4;
      uVar217 = (ushort)(((sVar335 + sVar239 + sVar417 * 7) - (uVar339 >> 8)) + sVar427) >> 4;
      uVar337 = (ushort)(((sVar336 + sVar240 + sVar422 * 7) - uVar337) + sVar365) >> 4;
      uVar339 = (ushort)(((sVar338 + sVar242 + sVar423 * 7) - sVar118) + sVar388) >> 4;
      uVar195 = (ushort)(((sVar340 + sVar243 + sVar169 * 7) - sVar119) + sVar305) >> 4;
      uVar451 = (ushort)((((uVar276 >> 8) + (uVar246 >> 8) + uVar278 * 7) - sVar120) + sVar309) >> 4
      ;
      auVar320[1] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar320[0] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar320[2] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
      auVar320[3] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar320[4] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
      auVar320[5] = (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339);
      auVar320[6] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar320[7] = (uVar451 != 0) * (uVar451 < 0x100) * (char)uVar451 - (0xff < uVar451);
      auVar320[8] = (uVar173 != 0) * (uVar173 < 0x100) * (char)uVar173 - (0xff < uVar173);
      auVar320[9] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar320[10] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
      auVar320[0xb] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
      auVar320[0xc] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
      auVar320[0xd] = (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339);
      auVar63._4_4_ = uVar421;
      auVar63._0_4_ = uVar122;
      auVar63._8_4_ = auVar395._12_4_;
      auVar63._12_4_ = uVar428;
      auVar392 = ~auVar70 & auVar63._0_14_ | auVar320 & auVar70;
    }
  }
  auVar69._8_4_ = uVar122;
  auVar69._0_8_ = CONCAT44(uVar428,uVar194);
  auVar68._12_4_ = uVar429;
  auVar68._0_12_ = auVar69;
  auVar297._0_14_ = auVar393._0_14_;
  auVar297[0xe] = uVar59;
  auVar297[0xf] = uVar60;
  auVar296._14_2_ = auVar297._14_2_;
  auVar296._0_13_ = auVar393._0_13_;
  auVar296[0xd] = uVar171;
  auVar295._13_3_ = auVar296._13_3_;
  auVar295._0_12_ = auVar393._0_12_;
  auVar295[0xc] = uVar208;
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._0_11_ = auVar393._0_11_;
  auVar294[0xb] = uVar58;
  auVar293._11_5_ = auVar294._11_5_;
  auVar293._0_10_ = auVar393._0_10_;
  auVar293[10] = uVar57;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._0_9_ = auVar393._0_9_;
  auVar292[9] = uVar430;
  auVar291._9_7_ = auVar292._9_7_;
  auVar291._0_8_ = auVar393._0_8_;
  auVar291[8] = auVar117[1];
  Var72 = CONCAT91(CONCAT81(auVar291._8_8_,uVar59),*puVar2);
  auVar97._2_10_ = Var72;
  auVar97[1] = uVar208;
  auVar97[0] = auVar233[0];
  auVar96._2_12_ = auVar97;
  auVar96[1] = uVar57;
  auVar96[0] = *puVar1;
  uVar453 = auVar117._0_2_;
  auVar290._2_14_ = auVar96;
  auVar139[0xe] = auVar392[7];
  auVar139._0_14_ = auVar392;
  auVar139[0xf] = auVar410[7];
  auVar138._14_2_ = auVar139._14_2_;
  auVar138._0_13_ = auVar392._0_13_;
  auVar138[0xd] = auVar410[6];
  auVar137._13_3_ = auVar138._13_3_;
  auVar137._0_12_ = auVar392._0_12_;
  auVar137[0xc] = auVar392[6];
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_11_ = auVar392._0_11_;
  auVar136[0xb] = auVar410[5];
  auVar135._11_5_ = auVar136._11_5_;
  auVar135._0_10_ = auVar392._0_10_;
  auVar135[10] = auVar392[5];
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._0_9_ = auVar392._0_9_;
  auVar134[9] = auVar410[4];
  auVar133._9_7_ = auVar134._9_7_;
  auVar133._0_8_ = auVar392._0_8_;
  auVar133[8] = auVar392[4];
  Var74 = CONCAT91(CONCAT81(auVar133._8_8_,auVar410[3]),auVar392[3]);
  auVar99._2_10_ = Var74;
  auVar99[1] = auVar410[2];
  auVar99[0] = auVar392[2];
  auVar98._2_12_ = auVar99;
  auVar98[1] = auVar410[1];
  auVar98[0] = auVar392[1];
  auVar301._0_12_ = auVar290._0_12_;
  auVar301._12_2_ = (short)Var72;
  auVar301._14_2_ = (short)Var74;
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._0_10_ = auVar290._0_10_;
  auVar300._10_2_ = auVar99._0_2_;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._0_8_ = auVar290._0_8_;
  auVar299._8_2_ = auVar97._0_2_;
  auVar100._4_8_ = auVar299._8_8_;
  auVar100._2_2_ = auVar98._0_2_;
  auVar100._0_2_ = auVar96._0_2_;
  auVar298._0_4_ = CONCAT22(CONCAT11(auVar410[0],auVar392[0]),uVar453);
  auVar298._4_12_ = auVar100;
  auVar147[0xe] = auVar175[7];
  auVar147._0_14_ = auVar175;
  auVar147[0xf] = auVar435[7];
  auVar146._14_2_ = auVar147._14_2_;
  auVar146._0_13_ = auVar175._0_13_;
  auVar146[0xd] = auVar435[6];
  auVar145._13_3_ = auVar146._13_3_;
  auVar145._0_12_ = auVar175._0_12_;
  auVar145[0xc] = auVar175[6];
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._0_11_ = auVar175._0_11_;
  auVar144[0xb] = auVar435[5];
  auVar143._11_5_ = auVar144._11_5_;
  auVar143._0_10_ = auVar175._0_10_;
  auVar143[10] = auVar175[5];
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_9_ = auVar175._0_9_;
  auVar142[9] = auVar435[4];
  auVar141._9_7_ = auVar142._9_7_;
  auVar141._0_8_ = auVar175._0_8_;
  auVar141[8] = auVar175[4];
  Var72 = CONCAT91(CONCAT81(auVar141._8_8_,auVar435[3]),auVar175[3]);
  auVar102._2_10_ = Var72;
  auVar102[1] = auVar435[2];
  auVar102[0] = auVar175[2];
  auVar101._2_12_ = auVar102;
  auVar101[1] = auVar435[1];
  auVar101[0] = auVar175[1];
  uVar452 = CONCAT11(auVar435[0],auVar175[0]);
  auVar140._2_14_ = auVar101;
  auVar191[0xe] = auVar198[7];
  auVar191._0_14_ = auVar198;
  auVar191[0xf] = auVar249[7];
  auVar190._14_2_ = auVar191._14_2_;
  auVar190._0_13_ = auVar198._0_13_;
  auVar190[0xd] = auVar249[6];
  auVar189._13_3_ = auVar190._13_3_;
  auVar189._0_12_ = auVar198._0_12_;
  auVar189[0xc] = auVar198[6];
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._0_11_ = auVar198._0_11_;
  auVar188[0xb] = auVar249[5];
  auVar187._11_5_ = auVar188._11_5_;
  auVar187._0_10_ = auVar198._0_10_;
  auVar187[10] = auVar198[5];
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._0_9_ = auVar198._0_9_;
  auVar186[9] = auVar249[4];
  auVar185._9_7_ = auVar186._9_7_;
  auVar185._0_8_ = auVar198._0_8_;
  auVar185[8] = auVar198[4];
  Var74 = CONCAT91(CONCAT81(auVar185._8_8_,auVar249[3]),auVar198[3]);
  auVar104._2_10_ = Var74;
  auVar104[1] = auVar249[2];
  auVar104[0] = auVar198[2];
  auVar103._2_12_ = auVar104;
  auVar103[1] = auVar249[1];
  auVar103[0] = auVar198[1];
  auVar150._0_12_ = auVar140._0_12_;
  auVar150._12_2_ = (short)Var72;
  auVar150._14_2_ = (short)Var74;
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._0_10_ = auVar140._0_10_;
  auVar149._10_2_ = auVar104._0_2_;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._0_8_ = auVar140._0_8_;
  auVar148._8_2_ = auVar102._0_2_;
  auVar105._4_8_ = auVar148._8_8_;
  auVar105._2_2_ = auVar103._0_2_;
  auVar105._0_2_ = auVar101._0_2_;
  auVar192._0_8_ = auVar298._0_8_;
  auVar192._8_4_ = auVar100._0_4_;
  auVar192._12_4_ = auVar105._0_4_;
  auVar273[0xe] = auVar249[7];
  auVar273._0_14_ = auVar249;
  auVar273[0xf] = auVar198[7];
  auVar272._14_2_ = auVar273._14_2_;
  auVar272._0_13_ = auVar249._0_13_;
  auVar272[0xd] = auVar198[6];
  auVar271._13_3_ = auVar272._13_3_;
  auVar271._0_12_ = auVar249._0_12_;
  auVar271[0xc] = auVar249[6];
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._0_11_ = auVar249._0_11_;
  auVar270[0xb] = auVar198[5];
  auVar269._11_5_ = auVar270._11_5_;
  auVar269._0_10_ = auVar249._0_10_;
  auVar269[10] = auVar249[5];
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_9_ = auVar249._0_9_;
  auVar268[9] = auVar198[4];
  auVar267._9_7_ = auVar268._9_7_;
  auVar267._0_8_ = auVar249._0_8_;
  auVar267[8] = auVar249[4];
  auVar444[0xe] = auVar435[7];
  auVar444._0_14_ = auVar435;
  auVar444[0xf] = auVar175[7];
  auVar443._14_2_ = auVar444._14_2_;
  auVar443._0_13_ = auVar435._0_13_;
  auVar443[0xd] = auVar175[6];
  auVar442._13_3_ = auVar443._13_3_;
  auVar442._0_12_ = auVar435._0_12_;
  auVar442[0xc] = auVar435[6];
  auVar441._12_4_ = auVar442._12_4_;
  auVar441._0_11_ = auVar435._0_11_;
  auVar441[0xb] = auVar175[5];
  auVar440._11_5_ = auVar441._11_5_;
  auVar440._0_10_ = auVar435._0_10_;
  auVar440[10] = auVar435[5];
  auVar439._10_6_ = auVar440._10_6_;
  auVar439._0_9_ = auVar435._0_9_;
  auVar439[9] = auVar175[4];
  auVar438._9_7_ = auVar439._9_7_;
  auVar438._0_8_ = auVar435._0_8_;
  auVar438[8] = auVar435[4];
  uVar122 = CONCAT22(auVar438._8_2_,auVar267._8_2_);
  auVar247._0_8_ = CONCAT26(auVar440._10_2_,CONCAT24(auVar269._10_2_,uVar122));
  auVar247._8_2_ = auVar271._12_2_;
  auVar247._10_2_ = auVar442._12_2_;
  auVar274._12_2_ = auVar272._14_2_;
  auVar274._0_12_ = auVar247;
  auVar274._14_2_ = auVar443._14_2_;
  auVar330[0xe] = auVar410[7];
  auVar330._0_14_ = auVar410;
  auVar330[0xf] = auVar392[7];
  auVar329._14_2_ = auVar330._14_2_;
  auVar329._0_13_ = auVar410._0_13_;
  auVar329[0xd] = auVar392[6];
  auVar328._13_3_ = auVar329._13_3_;
  auVar328._0_12_ = auVar410._0_12_;
  auVar328[0xc] = auVar410[6];
  auVar327._12_4_ = auVar328._12_4_;
  auVar327._0_11_ = auVar410._0_11_;
  auVar327[0xb] = auVar392[5];
  auVar326._11_5_ = auVar327._11_5_;
  auVar326._0_10_ = auVar410._0_10_;
  auVar326[10] = auVar410[5];
  auVar325._10_6_ = auVar326._10_6_;
  auVar325._0_9_ = auVar410._0_9_;
  auVar325[9] = auVar392[4];
  auVar324._9_7_ = auVar325._9_7_;
  auVar324._0_8_ = auVar410._0_8_;
  auVar324[8] = auVar410[4];
  auVar235._0_14_ = auVar68._0_14_;
  auVar235[0xe] = uVar60;
  auVar235[0xf] = puVar2[0xf];
  auVar234._14_2_ = auVar235._14_2_;
  auVar234._0_13_ = auVar68._0_13_;
  auVar234[0xd] = auVar233[0xf];
  auVar233._13_3_ = auVar234._13_3_;
  auVar233[0xc] = uVar171;
  auVar233._0_12_ = auVar69;
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._0_11_ = auVar69._0_11_;
  auVar232[0xb] = puVar1[0xf];
  auVar231._11_5_ = auVar232._11_5_;
  auVar231._0_10_ = auVar69._0_10_;
  auVar231[10] = uVar58;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._0_9_ = auVar69._0_9_;
  auVar230[9] = auVar117[0xf];
  auVar229._9_7_ = auVar230._9_7_;
  auVar229[8] = uVar430;
  auVar229._0_8_ = CONCAT44(uVar428,uVar194);
  uVar194 = CONCAT22(auVar229._8_2_,auVar324._8_2_);
  auVar319._0_8_ = CONCAT26(auVar231._10_2_,CONCAT24(auVar326._10_2_,uVar194));
  auVar319._8_2_ = auVar328._12_2_;
  auVar319._10_2_ = auVar233._12_2_;
  auVar331._12_2_ = auVar329._14_2_;
  auVar331._0_12_ = auVar319;
  auVar331._14_2_ = auVar234._14_2_;
  auVar117._8_4_ = (int)((ulong)auVar247._0_8_ >> 0x20);
  auVar117._0_8_ = auVar247._0_8_;
  auVar117._12_4_ = (int)((ulong)auVar319._0_8_ >> 0x20);
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(CONCAT11(auVar249[0],auVar198[0]),uVar452),auVar298._0_4_);
  *(ulong *)s = CONCAT44(uVar194,uVar122);
  *(long *)(s + lVar116 + -8) = auVar192._8_8_;
  *(long *)(s + lVar116 + -8 + 8) = auVar117._8_8_;
  puVar1 = s + lVar116 * 2 + -8;
  *(int *)puVar1 = auVar299._8_4_;
  *(int *)(puVar1 + 4) = auVar148._8_4_;
  *(int *)(puVar1 + 8) = auVar247._8_4_;
  *(int *)(puVar1 + 0xc) = auVar319._8_4_;
  *(undefined4 *)(s + lVar3) = auVar300._12_4_;
  *(undefined4 *)(s + lVar3 + 4) = auVar149._12_4_;
  *(int *)(s + lVar3 + 8) = auVar274._12_4_;
  *(int *)(s + lVar3 + 0xc) = auVar331._12_4_;
  return;
}

Assistant:

void aom_lpf_vertical_14_sse2(unsigned char *s, int p,
                              const unsigned char *_blimit,
                              const unsigned char *_limit,
                              const unsigned char *_thresh) {
  __m128i q7p7, q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i x6, x5, x4, x3;
  __m128i pq0, pq1, pq2, pq3;
  __m128i blimit = _mm_load_si128((__m128i *)_blimit);
  __m128i limit = _mm_load_si128((__m128i *)_limit);
  __m128i thresh = _mm_load_si128((__m128i *)_thresh);

  x6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * p));

  transpose_pq_14_sse2(&x6, &x5, &x4, &x3, &q0p0, &q1p1, &q2p2, &q3p3, &q4p4,
                       &q5p5, &q6p6, &q7p7);

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  transpose_pq_14_inv_sse2(&q7p7, &q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1,
                           &q0p0, &pq0, &pq1, &pq2, &pq3);
  _mm_storeu_si128((__m128i *)(s - 8 + 0 * p), pq0);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * p), pq1);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * p), pq2);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * p), pq3);
}